

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O0

void Wlc_BlastAdderCLA_int(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int CarryIn)

{
  int iVar1;
  int local_50;
  int local_4c;
  int Carry;
  int Pro;
  int Gen;
  int b;
  int *pCar;
  int *pPro;
  int *pGen;
  int CarryIn_local;
  int nBits_local;
  int *pAdd1_local;
  int *pAdd0_local;
  Gia_Man_t *pNew_local;
  
  pGen._0_4_ = CarryIn;
  pGen._4_4_ = nBits;
  _CarryIn_local = pAdd1;
  pAdd1_local = pAdd0;
  pAdd0_local = (int *)pNew;
  pPro = (int *)calloc((long)nBits,4);
  pCar = (int *)calloc((long)pGen._4_4_,4);
  _Gen = (int *)calloc((long)(pGen._4_4_ + 1),4);
  if (pGen._4_4_ == 1) {
    local_50 = (int)pGen;
    Wlc_BlastFullAdder((Gia_Man_t *)pAdd0_local,*pAdd1_local,*_CarryIn_local,(int)pGen,&local_50,
                       pAdd1_local);
  }
  else {
    if (pGen._4_4_ < 2) {
      __assert_fail("nBits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                    ,0x18c,"void Wlc_BlastAdderCLA_int(Gia_Man_t *, int *, int *, int, int)");
    }
    *_Gen = (int)pGen;
    for (Pro = 0; Pro < pGen._4_4_; Pro = Pro + 1) {
      iVar1 = Gia_ManHashAnd((Gia_Man_t *)pAdd0_local,pAdd1_local[Pro],_CarryIn_local[Pro]);
      pPro[Pro] = iVar1;
      iVar1 = Gia_ManHashXor((Gia_Man_t *)pAdd0_local,pAdd1_local[Pro],_CarryIn_local[Pro]);
      pCar[Pro] = iVar1;
    }
    Wlc_BlastAdderCLA_rec((Gia_Man_t *)pAdd0_local,pPro,pCar,_Gen,pGen._4_4_,&Carry,&local_4c);
    for (Pro = 0; Pro < pGen._4_4_; Pro = Pro + 1) {
      iVar1 = Gia_ManHashXor((Gia_Man_t *)pAdd0_local,pCar[Pro],_Gen[Pro]);
      pAdd1_local[Pro] = iVar1;
    }
    if (pPro != (int *)0x0) {
      free(pPro);
      pPro = (int *)0x0;
    }
    if (pCar != (int *)0x0) {
      free(pCar);
      pCar = (int *)0x0;
    }
    if (_Gen != (int *)0x0) {
      free(_Gen);
    }
  }
  return;
}

Assistant:

void Wlc_BlastAdderCLA_int( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int CarryIn ) // result is in pAdd0
{
    int * pGen = ABC_CALLOC( int, nBits );
    int * pPro = ABC_CALLOC( int, nBits );
    int * pCar = ABC_CALLOC( int, nBits+1 );
    int b, Gen, Pro;
    if ( nBits == 1 )
    {
        int Carry = CarryIn;
        Wlc_BlastFullAdder( pNew, pAdd0[0], pAdd1[0], Carry, &Carry, &pAdd0[0] );
        return;
    }
    assert( nBits >= 2 );
    pCar[0] = CarryIn;
    for ( b = 0; b < nBits; b++ )
    {
        pGen[b] = Gia_ManHashAnd(pNew, pAdd0[b], pAdd1[b]);
        pPro[b] = Gia_ManHashXor(pNew, pAdd0[b], pAdd1[b]);
    }
    Wlc_BlastAdderCLA_rec( pNew, pGen, pPro, pCar, nBits, &Gen, &Pro );
    for ( b = 0; b < nBits; b++ )
        pAdd0[b] = Gia_ManHashXor(pNew, pPro[b], pCar[b]);
    ABC_FREE(pGen);
    ABC_FREE(pPro);
    ABC_FREE(pCar);
}